

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# llb2Image.c
# Opt level: O1

void Llb_ImgQuantifyReset(Vec_Ptr_t *vDdMans)

{
  DdManager *table;
  long lVar1;
  
  if (0 < vDdMans->nSize) {
    lVar1 = 0;
    do {
      table = (DdManager *)vDdMans->pArray[lVar1];
      if (table->bFunc2 == (DdNode *)0x0) {
        __assert_fail("dd->bFunc2 != NULL",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/bdd/llb/llb2Image.c"
                      ,0x15a,"void Llb_ImgQuantifyReset(Vec_Ptr_t *)");
      }
      Cudd_RecursiveDeref(table,table->bFunc);
      table->bFunc = table->bFunc2;
      table->bFunc2 = (DdNode *)0x0;
      lVar1 = lVar1 + 1;
    } while (lVar1 < vDdMans->nSize);
  }
  return;
}

Assistant:

void Llb_ImgQuantifyReset( Vec_Ptr_t * vDdMans )
{
    DdManager * dd;
    int i;
    Vec_PtrForEachEntry( DdManager *, vDdMans, dd, i )
    {
        assert( dd->bFunc2 != NULL );
        Cudd_RecursiveDeref( dd, dd->bFunc );
        dd->bFunc = dd->bFunc2;
        dd->bFunc2 = NULL;
    }
}